

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.cc
# Opt level: O0

bool testing::Mock::VerifyAndClearExpectationsLocked(void *mock_obj)

{
  bool bVar1;
  bool bVar2;
  StateMap *pSVar3;
  size_type sVar4;
  mapped_type *pmVar5;
  reference ppUVar6;
  _Self local_38;
  _Self local_30;
  const_iterator it;
  FunctionMockers *mockers;
  void *pvStack_18;
  bool expectations_met;
  void *mock_obj_local;
  
  pvStack_18 = mock_obj;
  internal::MutexBase::AssertHeld((MutexBase *)internal::g_gmock_mutex);
  pSVar3 = anon_unknown_6::MockObjectRegistry::states
                     ((MockObjectRegistry *)(anonymous_namespace)::g_mock_object_registry);
  sVar4 = std::
          map<const_void_*,_testing::(anonymous_namespace)::MockObjectState,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_testing::(anonymous_namespace)::MockObjectState>_>_>
          ::count(pSVar3,&stack0xffffffffffffffe8);
  if (sVar4 == 0) {
    mock_obj_local._7_1_ = true;
  }
  else {
    bVar1 = true;
    pSVar3 = anon_unknown_6::MockObjectRegistry::states
                       ((MockObjectRegistry *)(anonymous_namespace)::g_mock_object_registry);
    pmVar5 = std::
             map<const_void_*,_testing::(anonymous_namespace)::MockObjectState,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_testing::(anonymous_namespace)::MockObjectState>_>_>
             ::operator[](pSVar3,&stack0xffffffffffffffe8);
    it._M_node = (_Base_ptr)&pmVar5->function_mockers;
    local_30._M_node =
         (_Base_ptr)
         std::
         set<testing::internal::UntypedFunctionMockerBase_*,_std::less<testing::internal::UntypedFunctionMockerBase_*>,_std::allocator<testing::internal::UntypedFunctionMockerBase_*>_>
         ::begin((set<testing::internal::UntypedFunctionMockerBase_*,_std::less<testing::internal::UntypedFunctionMockerBase_*>,_std::allocator<testing::internal::UntypedFunctionMockerBase_*>_>
                  *)it._M_node);
    while( true ) {
      local_38._M_node =
           (_Base_ptr)
           std::
           set<testing::internal::UntypedFunctionMockerBase_*,_std::less<testing::internal::UntypedFunctionMockerBase_*>,_std::allocator<testing::internal::UntypedFunctionMockerBase_*>_>
           ::end(it._M_node);
      bVar2 = std::operator==(&local_30,&local_38);
      mock_obj_local._7_1_ = bVar1;
      if (((bVar2 ^ 0xffU) & 1) == 0) break;
      ppUVar6 = std::_Rb_tree_const_iterator<testing::internal::UntypedFunctionMockerBase_*>::
                operator*(&local_30);
      bVar2 = internal::UntypedFunctionMockerBase::VerifyAndClearExpectationsLocked(*ppUVar6);
      if (!bVar2) {
        bVar1 = false;
      }
      std::_Rb_tree_const_iterator<testing::internal::UntypedFunctionMockerBase_*>::operator++
                (&local_30);
    }
  }
  return mock_obj_local._7_1_;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(internal::g_gmock_mutex) {
  internal::g_gmock_mutex.AssertHeld();
  if (g_mock_object_registry.states().count(mock_obj) == 0) {
    // No EXPECT_CALL() was set on the given mock object.
    return true;
  }

  // Verifies and clears the expectations on each mock method in the
  // given mock object.
  bool expectations_met = true;
  FunctionMockers& mockers =
      g_mock_object_registry.states()[mock_obj].function_mockers;
  for (FunctionMockers::const_iterator it = mockers.begin();
       it != mockers.end(); ++it) {
    if (!(*it)->VerifyAndClearExpectationsLocked()) {
      expectations_met = false;
    }
  }

  // We don't clear the content of mockers, as they may still be
  // needed by ClearDefaultActionsLocked().
  return expectations_met;
}